

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::PIQBase::Purpose_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  (**(code **)(*this + 0x48))(local_40);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x1a66aad);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
    local_60 = (long *)*plVar3;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_90 = *puVar6;
    uStack_88 = (undefined4)plVar3[3];
    uStack_84 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar6;
    local_a0 = (ulong *)*plVar3;
  }
  local_98 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (**(code **)(*this + 0x58))(&local_80,this);
  uVar7 = 0xf;
  if (local_a0 != &local_90) {
    uVar7 = local_90;
  }
  if (uVar7 < (ulong)(local_78 + local_98)) {
    uVar7 = 0xf;
    if (local_80 != local_70) {
      uVar7 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_00c2a33d;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_00c2a33d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Purpose()
	{
		return "Verify that the set of tested functions glGetProgram* return\n"
			   "expected results when used to get data from program\n"
			   "made of " +
			   ShadersDesc() + "." + PurposeExt();
	}